

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::init
          (TextureSizeCase *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Context *pCVar3;
  RenderContext *pRVar4;
  char *pcVar5;
  _Alloc_hider _Var6;
  ShaderProgram *this_00;
  size_type sVar7;
  bool bVar8;
  int iVar9;
  ContextType CVar10;
  GLSLVersion GVar11;
  undefined4 extraout_var;
  RenderTarget *pRVar12;
  ulong uVar13;
  char *pcVar14;
  mapped_type *pmVar15;
  pointer pcVar16;
  reference pvVar17;
  NotSupportedError *this_01;
  TestError *this_02;
  undefined4 uVar18;
  long lVar19;
  undefined4 uVar20;
  TextureSizeCase *ctx_00;
  int ndx;
  long lVar21;
  size_type __dnew;
  GLint maxTextureSize;
  GLint maxTextureLayers;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  specializationMap;
  GLint maxSamples;
  size_type __dnew_1;
  size_type __dnew_5;
  string local_2e0;
  int local_2c0;
  int local_2bc;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  int local_284;
  string local_280;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  ShaderProgram *local_238;
  RenderContext *local_230;
  long local_228;
  size_type local_220;
  uint local_218;
  value_type local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  int local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [3];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  undefined1 local_100 [208];
  
  ctx_00 = this;
  if (Functional::(anonymous_namespace)::TextureSizeCase::init()::testSizes2D == '\0') {
    _GLOBAL__N_1::TextureSizeCase::init((EVP_PKEY_CTX *)this);
  }
  if (Functional::(anonymous_namespace)::TextureSizeCase::init()::testSizes3D == '\0') {
    _GLOBAL__N_1::TextureSizeCase::init((EVP_PKEY_CTX *)ctx_00);
  }
  if (Functional::(anonymous_namespace)::TextureSizeCase::init()::fullscreenQuad == '\0') {
    _GLOBAL__N_1::TextureSizeCase::init((EVP_PKEY_CTX *)ctx_00);
  }
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar21 = CONCAT44(extraout_var,iVar9);
  CVar10.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar8 = glu::contextSupports(CVar10,(ApiType)0x23);
  if (((!bVar8) && (this->m_isArrayType != false)) &&
     (bVar8 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_OES_texture_storage_multisample_2d_array"), !bVar8)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Test requires OES_texture_storage_multisample_2d_array extension",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
               ,0xa7);
LAB_014ecd07:
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((pRVar12->m_width < 1) ||
     (pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context), pRVar12->m_height < 1))
  {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"rendertarget size must be at least 1x1",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
               ,0xaa);
    goto LAB_014ecd07;
  }
  uVar18 = 0;
  local_2c0 = 0;
  local_2bc = 0;
  local_284 = 0;
  (**(code **)(lVar21 + 0x868))(0xd33);
  (**(code **)(lVar21 + 0x868))(0x88ff,&local_2bc);
  uVar13 = (ulong)this->m_type;
  uVar20 = 0;
  if (uVar13 < 6) {
    uVar20 = *(undefined4 *)(&DAT_01ca0fcc + uVar13 * 4);
  }
  if (this->m_type < TEXTURE_LAST) {
    uVar18 = *(undefined4 *)(&DAT_01ca0fb4 + uVar13 * 4);
  }
  (**(code **)(lVar21 + 0x880))(uVar20,uVar18,0x80a9,1,&local_284);
  if (local_284 < this->m_numSamples) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"sample count is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
               ,0xb5);
    goto LAB_014ecd07;
  }
  local_228 = lVar21;
  local_238 = (ShaderProgram *)operator_new(0xd0);
  pCVar3 = (this->super_TestCase).m_context;
  pRVar4 = pCVar3->m_renderCtx;
  local_100[0x10] = 0;
  local_100._17_8_ = 0;
  local_100._0_8_ = (pointer)0x0;
  local_100[8] = 0;
  local_100._9_7_ = 0;
  memset(local_1b0,0,0xac);
  CVar10.super_ApiType.m_bits = (ApiType)(*pCVar3->m_renderCtx->_vptr_RenderContext[2])();
  GVar11 = glu::getContextTypeGLSLVersion(CVar10);
  p_Var1 = &local_2b8._M_impl.super__Rb_tree_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pcVar14 = glu::getGLSLVersionDeclaration(GVar11);
  local_2e0._M_dataplus._M_p = (pointer)0x11;
  local_260._0_8_ = &local_250;
  local_260._0_8_ = std::__cxx11::string::_M_create((ulong *)local_260,(ulong)&local_2e0);
  local_250._M_allocated_capacity = (size_type)local_2e0._M_dataplus._M_p;
  *(undefined8 *)local_260._0_8_ = 0x5245565f4c534c47;
  *(char *)(local_260._0_8_ + 8) = 'S';
  *(char *)(local_260._0_8_ + 9) = 'I';
  *(char *)(local_260._0_8_ + 10) = 'O';
  *(char *)(local_260._0_8_ + 0xb) = 'N';
  *(char *)(local_260._0_8_ + 0xc) = '_';
  *(char *)(local_260._0_8_ + 0xd) = 'D';
  *(char *)(local_260._0_8_ + 0xe) = 'E';
  *(char *)(local_260._0_8_ + 0xf) = 'C';
  *(char *)(local_260._0_8_ + 0x10) = 'L';
  local_260._8_8_ = local_2e0._M_dataplus._M_p;
  *(char *)(local_260._0_8_ + (long)local_2e0._M_dataplus._M_p) = '\0';
  local_230 = pRVar4;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_2b8,(key_type *)local_260);
  pcVar5 = (char *)pmVar15->_M_string_length;
  strlen(pcVar14);
  std::__cxx11::string::_M_replace((ulong)pmVar15,0,pcVar5,(ulong)pcVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._0_8_ != &local_250) {
    operator_delete((void *)local_260._0_8_,local_250._M_allocated_capacity + 1);
  }
  paVar2 = &local_2e0.field_2;
  local_280._M_dataplus._M_p = (pointer)0x5f;
  local_2e0._M_dataplus._M_p = (pointer)paVar2;
  pcVar16 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e0,(ulong)&local_280);
  _Var6._M_p = local_280._M_dataplus._M_p;
  local_2e0.field_2._M_allocated_capacity._0_7_ = SUB87(local_280._M_dataplus._M_p,0);
  local_2e0.field_2._M_local_buf[7] = (char)((ulong)local_280._M_dataplus._M_p >> 0x38);
  local_2e0._M_dataplus._M_p = pcVar16;
  memcpy(pcVar16,
         "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
         ,0x5f);
  local_2e0._M_string_length = (size_type)_Var6._M_p;
  pcVar16[_Var6._M_p] = '\0';
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_260,&local_2e0);
  tcu::StringTemplate::specialize
            (&local_1d0,(StringTemplate *)local_260,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2b8);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT17(local_2e0.field_2._M_local_buf[7],
                             local_2e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2b8);
  local_218 = 0;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,local_1d0._M_dataplus._M_p,
             local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (ulong)local_218 * 0x18),&local_210);
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  switch(this->m_type) {
  case TEXTURE_FLOAT_2D:
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x52454c504d4153;
    local_2e0.field_2._M_local_buf[7] = 'T';
    local_2e0.field_2._M_local_buf[8] = 'Y';
    local_2e0.field_2._9_2_ = 0x4550;
    local_2e0._M_string_length = 0xb;
    local_2e0.field_2._M_local_buf[0xb] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x1af194e);
    break;
  case TEXTURE_FLOAT_2D_ARRAY:
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x52454c504d4153;
    local_2e0.field_2._M_local_buf[7] = 'T';
    local_2e0.field_2._M_local_buf[8] = 'Y';
    local_2e0.field_2._9_2_ = 0x4550;
    local_2e0._M_string_length = 0xb;
    local_2e0.field_2._M_local_buf[0xb] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x1af1962);
    break;
  case TEXTURE_INT_2D:
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x52454c504d4153;
    local_2e0.field_2._M_local_buf[7] = 'T';
    local_2e0.field_2._M_local_buf[8] = 'Y';
    local_2e0.field_2._9_2_ = 0x4550;
    local_2e0._M_string_length = 0xb;
    local_2e0.field_2._M_local_buf[0xb] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x1af191f);
    break;
  case TEXTURE_INT_2D_ARRAY:
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x52454c504d4153;
    local_2e0.field_2._M_local_buf[7] = 'T';
    local_2e0.field_2._M_local_buf[8] = 'Y';
    local_2e0.field_2._9_2_ = 0x4550;
    local_2e0._M_string_length = 0xb;
    local_2e0.field_2._M_local_buf[0xb] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x1af1934);
    break;
  case TEXTURE_UINT_2D:
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x52454c504d4153;
    local_2e0.field_2._M_local_buf[7] = 'T';
    local_2e0.field_2._M_local_buf[8] = 'Y';
    local_2e0.field_2._9_2_ = 0x4550;
    local_2e0._M_string_length = 0xb;
    local_2e0.field_2._M_local_buf[0xb] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x1af197b);
    break;
  case TEXTURE_UINT_2D_ARRAY:
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x52454c504d4153;
    local_2e0.field_2._M_local_buf[7] = 'T';
    local_2e0.field_2._M_local_buf[8] = 'Y';
    local_2e0.field_2._9_2_ = 0x4550;
    local_2e0._M_string_length = 0xb;
    local_2e0.field_2._M_local_buf[0xb] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x1af1990);
    break;
  default:
    goto switchD_014ec3b7_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT17(local_2e0.field_2._M_local_buf[7],
                             local_2e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
switchD_014ec3b7_default:
  if (this->m_isArrayType == false) {
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x505954455a4953;
    local_2e0.field_2._M_local_buf[7] = 'E';
    local_2e0._M_string_length = 8;
    local_2e0.field_2._M_local_buf[8] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x1ccbc1c);
  }
  else {
    local_2e0.field_2._M_allocated_capacity._0_7_ = 0x505954455a4953;
    local_2e0.field_2._M_local_buf[7] = 'E';
    local_2e0._M_string_length = 8;
    local_2e0.field_2._M_local_buf[8] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x1a89a67);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT17(local_2e0.field_2._M_local_buf[7],
                             local_2e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  CVar10.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar8 = glu::contextSupports(CVar10,(ApiType)0x23);
  if (bVar8 || this->m_isArrayType != true) {
    local_280._M_dataplus._M_p = &DAT_00000013;
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    local_2e0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e0,(ulong)&local_280);
    local_2e0.field_2._M_allocated_capacity._0_7_ = SUB87(local_280._M_dataplus._M_p,0);
    local_2e0.field_2._M_local_buf[7] = (char)((ulong)local_280._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_2e0._M_dataplus._M_p,"EXTENSION_STATEMENT",0x13);
    local_2e0._M_string_length = (size_type)local_280._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p[(long)local_280._M_dataplus._M_p] = '\0';
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x1b3c1e9);
  }
  else {
    local_280._M_dataplus._M_p = &DAT_00000013;
    local_2e0._M_dataplus._M_p = (pointer)paVar2;
    local_2e0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e0,(ulong)&local_280);
    local_2e0.field_2._M_allocated_capacity._0_7_ = SUB87(local_280._M_dataplus._M_p,0);
    local_2e0.field_2._M_local_buf[7] = (char)((ulong)local_280._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_2e0._M_dataplus._M_p,"EXTENSION_STATEMENT",0x13);
    local_2e0._M_string_length = (size_type)local_280._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p[(long)local_280._M_dataplus._M_p] = '\0';
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2b8,&local_2e0);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x1c7e30e);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT17(local_2e0.field_2._M_local_buf[7],
                             local_2e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  GVar11 = glu::getContextTypeGLSLVersion(CVar10);
  pcVar14 = glu::getGLSLVersionDeclaration(GVar11);
  local_280._M_dataplus._M_p = (pointer)0x11;
  local_2e0._M_dataplus._M_p = (pointer)paVar2;
  local_2e0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e0,(ulong)&local_280);
  local_2e0.field_2._M_allocated_capacity._0_7_ = SUB87(local_280._M_dataplus._M_p,0);
  local_2e0.field_2._M_local_buf[7] = (char)((ulong)local_280._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_2e0._M_dataplus._M_p,"GLSL_VERSION_DECL",0x11);
  local_2e0._M_string_length = (size_type)local_280._M_dataplus._M_p;
  local_2e0._M_dataplus._M_p[(long)local_280._M_dataplus._M_p] = '\0';
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_2b8,&local_2e0);
  pcVar5 = (char *)pmVar15->_M_string_length;
  strlen(pcVar14);
  std::__cxx11::string::_M_replace((ulong)pmVar15,0,pcVar5,(ulong)pcVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT17(local_2e0.field_2._M_local_buf[7],
                             local_2e0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  local_220 = 0x172;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  pcVar16 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_280,(ulong)&local_220);
  sVar7 = local_220;
  local_280.field_2._M_allocated_capacity = local_220;
  local_280._M_dataplus._M_p = pcVar16;
  memcpy(pcVar16,
         "${GLSL_VERSION_DECL}\n${EXTENSION_STATEMENT}layout(location = 0) out highp vec4 fragColor;\nuniform highp ${SAMPLERTYPE} u_sampler;\nuniform highp ${SIZETYPE} u_size;\nvoid main (void)\n{\n\tconst highp vec4 okColor = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 failColor = vec4(1.0, 0.0, 0.0, 1.0);\n\tfragColor = (textureSize(u_sampler) == u_size) ? (okColor) : (failColor);\n}\n"
         ,0x172);
  local_280._M_string_length = sVar7;
  pcVar16[sVar7] = '\0';
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_2e0,&local_280);
  tcu::StringTemplate::specialize
            (&local_1f0,(StringTemplate *)&local_2e0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2b8);
  pRVar4 = local_230;
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2b8);
  local_260._0_4_ = 1;
  local_260._8_8_ = local_250._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_260 + 8),local_1f0._M_dataplus._M_p,
             local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
  this_00 = local_238;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_260._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_260 + 8));
  glu::ShaderProgram::ShaderProgram(this_00,pRVar4,(ProgramSources *)local_1b0);
  this->m_shader = this_00;
  if ((char *)local_260._8_8_ != local_250._M_local_buf + 8) {
    operator_delete((void *)local_260._8_8_,local_250._8_8_ + 1);
  }
  lVar21 = local_228;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_120);
  lVar19 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + lVar19));
    lVar19 = lVar19 + -0x18;
  } while (lVar19 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_shader);
  if ((this->m_shader->m_program).m_info.linkOk == false) {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0 = (undefined1  [8])local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"shader build failed","");
    tcu::TestError::TestError(this_02,(string *)local_1b0);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar21 + 0x6c8))(1,&this->m_vbo);
  (**(code **)(lVar21 + 0x40))(0x8892,this->m_vbo);
  (**(code **)(lVar21 + 0x150))(0x8892,0x40,init::fullscreenQuad,0x88e4);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"GL_MAX_TEXTURE_SIZE = ",0x16);
  std::ostream::operator<<((ostringstream *)&local_1a8,local_2c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"GL_MAX_ARRAY_TEXTURE_LAYERS = ",0x1e);
  std::ostream::operator<<((ostringstream *)&local_1a8,local_2bc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if (this->m_isArrayType == false) {
    lVar21 = 0;
    do {
      local_1b0._0_4_ = init::testSizes2D[lVar21].m_data[0];
      if (((int)local_1b0._0_4_ <= local_2c0) &&
         (local_1b0._4_4_ = init::testSizes2D[lVar21].m_data[1], (int)local_1b0._4_4_ <= local_2c0))
      {
        if ((int)local_1b0._0_4_ < 0) {
          local_1b0._0_4_ = local_2c0;
        }
        if ((int)local_1b0._4_4_ < 0) {
          local_1b0._4_4_ = local_2c0;
        }
        local_1a8 = 0;
        pvVar17 = std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
                  emplace_back<tcu::Vector<int,3>>
                            ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                             &this->m_iterations,(Vector<int,_3> *)local_1b0);
        local_1b0._0_4_ = SUB84(pvVar17,0);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 7);
  }
  else {
    lVar21 = 8;
    do {
      local_1b0._0_4_ =
           *(undefined4 *)
            (&Functional::(anonymous_namespace)::TextureSizeCase::init()::testSizes2D + lVar21);
      if ((((int)local_1b0._0_4_ <= local_2c0) &&
          (local_1b0._4_4_ = *(int *)(lVar21 + 0x22ac82c), (int)local_1b0._4_4_ <= local_2c0)) &&
         (iVar9 = *(int *)((long)init::testSizes3D[0].m_data + lVar21), iVar9 <= local_2bc)) {
        if ((int)local_1b0._0_4_ < 0) {
          local_1b0._0_4_ = local_2c0;
        }
        if ((int)local_1b0._4_4_ < 0) {
          local_1b0._4_4_ = local_2c0;
        }
        local_1a8 = local_2bc;
        if (-1 < iVar9) {
          local_1a8 = iVar9;
        }
        pvVar17 = std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
                  emplace_back<tcu::Vector<int,3>>
                            ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)
                             &this->m_iterations,(Vector<int,_3> *)local_1b0);
        local_1b0._0_4_ = SUB84(pvVar17,0);
      }
      lVar21 = lVar21 + 0xc;
    } while (lVar21 != 0x68);
  }
  return local_1b0._0_4_;
}

Assistant:

void TextureSizeCase::init (void)
{
	static const tcu::IVec2 testSizes2D[] =
	{
		tcu::IVec2(1,	1),
		tcu::IVec2(1,	4),
		tcu::IVec2(4,	8),
		tcu::IVec2(21,	11),
		tcu::IVec2(107,	254),
		tcu::IVec2(-1,	3),
		tcu::IVec2(3,	-1),
	};
	static const tcu::IVec3 testSizes3D[] =
	{
		tcu::IVec3(1,	1,		1),
		tcu::IVec3(1,	4,		7),
		tcu::IVec3(4,	8,		12),
		tcu::IVec3(21,	11,		9),
		tcu::IVec3(107,	254,	2),
		tcu::IVec3(-1,	3,		3),
		tcu::IVec3(3,	-1,		3),
		tcu::IVec3(4,	4,		-1),
	};
	static const tcu::Vec4 fullscreenQuad[] =
	{
		tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f)
	};

	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements
	if (m_isArrayType && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		TCU_THROW(NotSupportedError, "Test requires OES_texture_storage_multisample_2d_array extension");

	if (m_context.getRenderTarget().getWidth() < 1 || m_context.getRenderTarget().getHeight() < 1)
		TCU_THROW(NotSupportedError, "rendertarget size must be at least 1x1");

	glw::GLint				maxTextureSize		= 0;
	glw::GLint				maxTextureLayers	= 0;
	glw::GLint				maxSamples			= 0;

	gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);
	gl.getIntegerv(GL_MAX_ARRAY_TEXTURE_LAYERS, &maxTextureLayers);
	gl.getInternalformativ(getTextureGLTarget(), getTextureGLInternalFormat(), GL_SAMPLES, 1, &maxSamples);

	if (m_numSamples > maxSamples)
		TCU_THROW(NotSupportedError, "sample count is not supported");

	// gen shade

	m_shader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(specializeShader(m_context, s_positionVertexShaderSource)) << glu::FragmentSource(genFragmentSource()));
	m_testCtx.getLog() << *m_shader;
	if (!m_shader->isOk())
		throw tcu::TestError("shader build failed");

	// gen buffer

	gl.genBuffers(1, &m_vbo);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(fullscreenQuad), fullscreenQuad, GL_STATIC_DRAW);

	// gen iterations

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "GL_MAX_TEXTURE_SIZE = " << maxTextureSize << "\n"
		<< "GL_MAX_ARRAY_TEXTURE_LAYERS = " << maxTextureLayers
		<< tcu::TestLog::EndMessage;

	if (!m_isArrayType)
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(testSizes2D); ++ndx)
		{
			if (testSizes2D[ndx].x() <= maxTextureSize && testSizes2D[ndx].y() <= maxTextureSize)
			{
				const int w = (testSizes2D[ndx].x() < 0) ? (maxTextureSize) : (testSizes2D[ndx].x());
				const int h = (testSizes2D[ndx].y() < 0) ? (maxTextureSize) : (testSizes2D[ndx].y());

				m_iterations.push_back(tcu::IVec3(w, h, 0));
			}
		}
	}
	else
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(testSizes3D); ++ndx)
		{
			if (testSizes3D[ndx].x() <= maxTextureSize && testSizes3D[ndx].y() <= maxTextureSize && testSizes3D[ndx].z() <= maxTextureLayers)
			{
				const int w = (testSizes3D[ndx].x() < 0) ? (maxTextureSize)		: (testSizes3D[ndx].x());
				const int h = (testSizes3D[ndx].y() < 0) ? (maxTextureSize)		: (testSizes3D[ndx].y());
				const int d = (testSizes3D[ndx].z() < 0) ? (maxTextureLayers)	: (testSizes3D[ndx].z());

				m_iterations.push_back(tcu::IVec3(w, h, d));
			}
		}
	}
}